

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O1

string * convert<float>(string *__return_storage_ptr__,float *x,size_t count,size_t stride)

{
  undefined8 in_R8;
  undefined8 in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
  if (count != 0) {
    do {
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_50,vsnprintf,0x3a,"%f",(double)*x,in_R8,in_R9,paVar1);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (count != 1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      x = (float *)((long)x + stride);
      count = count - 1;
    } while (count != 0);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string convert(T* x, size_t count, size_t stride)
{
    std::string result = "[";
    for (size_t i = 0; i < count; ++i)
    {
        result += std::to_string(*x);
        if (i != count - 1)
            result += ", ";

        x = (T*) ((char*) x + stride);      // this is horribly ugly, but technically correct
    }
    result += "]";
    return result;
}